

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O1

void __thiscall IZDeflate::send_tree(IZDeflate *this,ct_data *tree,int max_code)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  if (-1 < max_code) {
    uVar1 = (tree->dl).dad;
    uVar3 = 0x8a;
    if (uVar1 != 0) {
      uVar3 = 7;
    }
    iVar2 = (uVar1 != 0) + 3;
    uVar5 = 0xffffffff;
    uVar4 = 0;
    uVar6 = (uint)uVar1;
    iVar9 = 0;
    do {
      uVar10 = (ulong)uVar6;
      uVar7 = (uint)tree[uVar4 + 1].dl.dad;
      iVar8 = iVar9 + 1;
      if (((int)uVar3 <= iVar8) || (uVar6 != uVar7)) {
        if (iVar8 < iVar2) {
          do {
            send_bits(this,(uint)this->bl_tree[uVar10].fc.freq,(uint)this->bl_tree[uVar10].dl.dad);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        else {
          if (uVar6 == 0) {
            if (iVar9 < 10) {
              send_bits(this,(uint)this->bl_tree[0x11].fc.freq,(uint)this->bl_tree[0x11].dl.dad);
              iVar8 = iVar9 + -2;
              iVar9 = 3;
            }
            else {
              send_bits(this,(uint)this->bl_tree[0x12].fc.freq,(uint)this->bl_tree[0x12].dl.dad);
              iVar8 = iVar9 + -10;
              iVar9 = 7;
            }
          }
          else {
            if (uVar6 != (uint)uVar5) {
              send_bits(this,(uint)this->bl_tree[uVar10].fc.freq,(uint)this->bl_tree[uVar10].dl.dad)
              ;
              iVar8 = iVar9;
            }
            send_bits(this,(uint)this->bl_tree[0x10].fc.freq,(uint)this->bl_tree[0x10].dl.dad);
            iVar8 = iVar8 + -3;
            iVar9 = 2;
          }
          send_bits(this,iVar8,iVar9);
        }
        iVar8 = 0;
        uVar5 = uVar10;
        if (uVar7 == 0) {
          iVar2 = 3;
          uVar3 = 0x8a;
        }
        else {
          iVar2 = 4 - (uint)(uVar6 == uVar7);
          uVar3 = uVar6 == uVar7 ^ 7;
        }
      }
      uVar4 = uVar4 + 1;
      uVar6 = uVar7;
      iVar9 = iVar8;
    } while (uVar4 != max_code + 1);
  }
  return;
}

Assistant:

void IZDeflate::send_tree (ct_data near *tree, int max_code)
    // ct_data near *tree; /* the tree to be scanned */
    // int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(curlen, bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(curlen, bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(REP_3_6, bl_tree); send_bits(count-3, 2);

        } else if (count <= 10) {
            send_code(REPZ_3_10, bl_tree); send_bits(count-3, 3);

        } else {
            send_code(REPZ_11_138, bl_tree); send_bits(count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}